

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * Curl_cpool_get_conn(Curl_easy *data,curl_off_t conn_id)

{
  curl_off_t local_38;
  cpool_find_ctx fctx;
  cpool *cpool;
  curl_off_t conn_id_local;
  Curl_easy *data_local;
  
  fctx.conn = (connectdata *)cpool_get_instance(data);
  if (fctx.conn == (connectdata *)0x0) {
    data_local = (Curl_easy *)0x0;
  }
  else {
    fctx.id = 0;
    local_38 = conn_id;
    if (fctx.conn != (connectdata *)0x0) {
      if (((Curl_share *)((fctx.conn)->conn_to_host).rawalloc != (Curl_share *)0x0) &&
         ((((Curl_share *)((fctx.conn)->conn_to_host).rawalloc)->specifier & 0x20) != 0)) {
        Curl_share_lock((Curl_easy *)(fctx.conn)->hostname_resolve,CURL_LOCK_DATA_CONNECT,
                        CURL_LOCK_ACCESS_SINGLE);
      }
      *(byte *)&((fctx.conn)->conn_to_host).name =
           *(byte *)&((fctx.conn)->conn_to_host).name & 0xfe | 1;
    }
    cpool_foreach((Curl_easy *)(fctx.conn)->hostname_resolve,(cpool *)fctx.conn,&local_38,
                  cpool_find_conn);
    if (((fctx.conn != (connectdata *)0x0) &&
        (*(byte *)&((fctx.conn)->conn_to_host).name =
              *(byte *)&((fctx.conn)->conn_to_host).name & 0xfe,
        ((fctx.conn)->conn_to_host).rawalloc != (char *)0x0)) &&
       ((*(uint *)(((fctx.conn)->conn_to_host).rawalloc + 4) & 0x20) != 0)) {
      Curl_share_unlock((Curl_easy *)(fctx.conn)->hostname_resolve,CURL_LOCK_DATA_CONNECT);
    }
    data_local = (Curl_easy *)fctx.id;
  }
  return (connectdata *)data_local;
}

Assistant:

struct connectdata *Curl_cpool_get_conn(struct Curl_easy *data,
                                        curl_off_t conn_id)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_find_ctx fctx;

  if(!cpool)
    return NULL;
  fctx.id = conn_id;
  fctx.conn = NULL;
  CPOOL_LOCK(cpool);
  cpool_foreach(cpool->idata, cpool, &fctx, cpool_find_conn);
  CPOOL_UNLOCK(cpool);
  return fctx.conn;
}